

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O2

int __thiscall Imf_2_5::TiledInputFile::numLevels(TiledInputFile *this)

{
  ostream *poVar1;
  char *pcVar2;
  LogicExc *this_00;
  stringstream _iex_throw_s;
  ostream local_188 [376];
  
  if ((this->_data->tileDesc).mode != RIPMAP_LEVELS) {
    return this->_data->numXLevels;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar1 = std::operator<<(local_188,"Error calling numLevels() on image file \"");
  pcVar2 = fileName(this);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"\" (numLevels() is not defined for files with RIPMAP level mode).");
  this_00 = (LogicExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::LogicExc::LogicExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_2_5::LogicExc::typeinfo,Iex_2_5::LogicExc::~LogicExc);
}

Assistant:

LevelMode
TiledInputFile::levelMode () const
{
    return _data->tileDesc.mode;
}